

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O3

void __thiscall IniProcessing::setValue(IniProcessing *this,char *key,char *value)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,value,&local_39);
  writeIniParam(this,key,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void IniProcessing::setValue(const char *key, const char *value)
{
    writeIniParam(key, value);
}